

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

Value * __thiscall
minja::CallExpr::do_evaluate
          (Value *__return_storage_ptr__,CallExpr *this,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  runtime_error *prVar1;
  ArgumentsValue vargs;
  string local_98;
  Value obj;
  
  this_00 = (this->object).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Expression *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"CallExpr.object is null");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Expression::evaluate(&obj,this_00,context);
  if (obj.callable_.
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    ArgumentsExpression::evaluate(&vargs,&this->args,context);
    Value::call(__return_storage_ptr__,&obj,context,&vargs);
    ArgumentsValue::~ArgumentsValue(&vargs);
    Value::~Value(&obj);
    return __return_storage_ptr__;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  Value::dump_abi_cxx11_(&local_98,&obj,2,false);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vargs,
                 "Object is not callable: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  std::runtime_error::runtime_error(prVar1,(string *)&vargs);
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!object) throw std::runtime_error("CallExpr.object is null");
        auto obj = object->evaluate(context);
        if (!obj.is_callable()) {
          throw std::runtime_error("Object is not callable: " + obj.dump(2));
        }
        auto vargs = args.evaluate(context);
        return obj.call(context, vargs);
    }